

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_classes.c
# Opt level: O3

void init_builtin_classes(void)

{
  objc_load_class(&_OBJC_CLASS_Object);
  objc_load_class(&_OBJC_CLASS_Protocol);
  objc_load_class(&_OBJC_CLASS_ProtocolGCC);
  objc_load_class(&_OBJC_CLASS_ProtocolGSv1);
  objc_load_class(&_OBJC_CLASS___IncompleteProtocol);
  objc_resolve_class(&_OBJC_CLASS_Object);
  objc_resolve_class(&_OBJC_CLASS_Protocol);
  objc_resolve_class(&_OBJC_CLASS_ProtocolGCC);
  objc_resolve_class(&_OBJC_CLASS_ProtocolGSv1);
  objc_resolve_class(&_OBJC_CLASS___IncompleteProtocol);
  _OBJC_CLASS_Object.instance_size = 8;
  _OBJC_CLASS_Protocol.instance_size = 0x58;
  _OBJC_CLASS___IncompleteProtocol.instance_size = 0x58;
  objc_load_class(&_OBJC_CLASS__ObjC_Protocol_Holder_Ugly_Hack);
  objc_resolve_class(&_OBJC_CLASS__ObjC_Protocol_Holder_Ugly_Hack);
  return;
}

Assistant:

PRIVATE void init_builtin_classes(void)
{
	// Load the classes that are compiled into the runtime.
	objc_load_class(&_OBJC_CLASS_Object);
	objc_load_class(&_OBJC_CLASS_Protocol);
	objc_load_class(&_OBJC_CLASS_ProtocolGCC);
	objc_load_class(&_OBJC_CLASS_ProtocolGSv1);
	objc_load_class(&_OBJC_CLASS___IncompleteProtocol);
	objc_resolve_class(&_OBJC_CLASS_Object);
	objc_resolve_class(&_OBJC_CLASS_Protocol);
	objc_resolve_class(&_OBJC_CLASS_ProtocolGCC);
	objc_resolve_class(&_OBJC_CLASS_ProtocolGSv1);
	objc_resolve_class(&_OBJC_CLASS___IncompleteProtocol);
	// Fix up the sizes of the various protocol classes that we will use.
	_OBJC_CLASS_Object.instance_size = sizeof(void*);
	_OBJC_CLASS_Protocol.instance_size = sizeof(struct objc_protocol);
	_OBJC_CLASS___IncompleteProtocol.instance_size = sizeof(struct objc_protocol);
#ifdef OLDABI_COMPAT
	objc_load_class(&_OBJC_CLASS__ObjC_Protocol_Holder_Ugly_Hack);
	objc_resolve_class(&_OBJC_CLASS__ObjC_Protocol_Holder_Ugly_Hack);
#endif
}